

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeField(ParserImpl *this,Message *message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Finder *pFVar2;
  char *pcVar3;
  OneofDescriptor *oneof_descriptor;
  ushort *puVar4;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> __n;
  pointer __n_00;
  int32_t number;
  size_type __n_01;
  bool bVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ExtensionRange *pEVar8;
  undefined4 extraout_var_01;
  Descriptor *pDVar9;
  Descriptor *pDVar10;
  ReservedRange *pRVar11;
  FieldDescriptor *pFVar12;
  MessageFactory *factory;
  MessageLite *this_00;
  Nonnull<const_char_*> pcVar13;
  ulong uVar14;
  Reflection *this_01;
  undefined8 uVar15;
  _Alloc_hider _Var16;
  _Alloc_hider in_R8;
  ulong uVar17;
  byte bVar18;
  ulong uVar19;
  string_view text;
  string_view name;
  string_view name_00;
  string_view lowercase_name;
  string_view data;
  Metadata MVar20;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view message_06;
  string_view message_07;
  string_view message_08;
  string_view printable_name;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces_02;
  FieldDescriptor *field;
  int32_t val;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  undefined8 local_240;
  char *local_238;
  ulong local_230;
  char *local_228;
  undefined8 local_220;
  char *local_218;
  Reflection *local_210;
  string field_name;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [32];
  string prefix_and_full_type_name;
  string full_type_name;
  FieldDescriptor *any_value_field;
  FieldDescriptor *any_type_url_field;
  uint local_14c;
  string serialized_value;
  string local_118;
  string local_f8;
  int start_column;
  int start_line;
  string prefix;
  string local_a0;
  anon_class_32_4_2c58ab61 skip_parsing;
  AlphaNum local_60;
  undefined4 extraout_var_02;
  
  MVar20 = Message::GetMetadata(message);
  this_01 = MVar20.reflection;
  MVar20 = Message::GetMetadata(message);
  pDVar10 = MVar20.descriptor;
  field_name._M_dataplus._M_p = (pointer)&field_name.field_2;
  field_name._M_string_length = 0;
  field_name.field_2._M_local_buf[0] = '\0';
  field = (FieldDescriptor *)0x0;
  start_line = (this->tokenizer_).current_.line;
  skip_parsing.start_line = &start_line;
  start_column = (this->tokenizer_).current_.column;
  skip_parsing.start_column = &start_column;
  skip_parsing.this = this;
  skip_parsing.field = &field;
  bVar5 = internal::GetAnyFieldDescriptors(message,&any_type_url_field,&any_value_field);
  if (bVar5) {
    _val = (pointer)&local_250;
    std::__cxx11::string::_M_construct<char_const*>((string *)&val,"[","");
    bVar5 = TryConsume(this,(string *)&val);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_val != &local_250) {
      operator_delete(_val,local_250._M_allocated_capacity + 1);
    }
    if (!bVar5) goto LAB_00254e94;
    full_type_name._M_string_length = 0;
    full_type_name.field_2._M_local_buf[0] = '\0';
    prefix._M_string_length = 0;
    prefix.field_2._M_local_buf[0] = '\0';
    local_210 = this_01;
    full_type_name._M_dataplus._M_p = (pointer)&full_type_name.field_2;
    prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
    bVar5 = ConsumeAnyTypeUrl(this,&full_type_name,&prefix);
    if (bVar5) {
      _val = (pointer)prefix._M_string_length;
      local_258._M_head_impl = (LogMessageData *)prefix._M_dataplus._M_p;
      local_1e8._0_8_ = full_type_name._M_string_length;
      local_1e8._8_8_ = full_type_name._M_dataplus._M_p;
      absl::lts_20250127::StrCat_abi_cxx11_
                (&prefix_and_full_type_name,(lts_20250127 *)&val,(AlphaNum *)local_1e8,
                 (AlphaNum *)full_type_name._M_string_length);
      _val = (pointer)&local_250;
      std::__cxx11::string::_M_construct<char_const*>((string *)&val,"]","");
      bVar5 = ConsumeBeforeWhitespace(this,(string *)&val);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_val != &local_250) {
        operator_delete(_val,local_250._M_allocated_capacity + 1);
      }
      if (bVar5) {
        TryConsumeWhitespace(this);
        _val = (pointer)&local_250;
        std::__cxx11::string::_M_construct<char_const*>((string *)&val,":","");
        bVar5 = TryConsumeBeforeWhitespace(this,(string *)&val);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_val != &local_250) {
          operator_delete(_val,local_250._M_allocated_capacity + 1);
        }
        if (bVar5) {
          TryConsumeWhitespace(this);
        }
        paVar1 = &serialized_value.field_2;
        serialized_value._M_string_length = 0;
        serialized_value.field_2._M_local_buf[0] = '\0';
        pFVar2 = this->finder_;
        serialized_value._M_dataplus._M_p = (pointer)paVar1;
        if (pFVar2 == (Finder *)0x0) {
          pDVar10 = anon_unknown_14::DefaultFinderFindAnyType(message,&prefix,&full_type_name);
        }
        else {
          iVar7 = (*pFVar2->_vptr_Finder[4])(pFVar2,message,&prefix,&full_type_name);
          pDVar10 = (Descriptor *)CONCAT44(extraout_var,iVar7);
        }
        if (pDVar10 == (Descriptor *)0x0) {
          _val = (pointer)0x15;
          local_258._M_head_impl = (LogMessageData *)0x385b7f;
          local_1e8._0_8_ = prefix_and_full_type_name._M_string_length;
          local_1e8._8_8_ = prefix_and_full_type_name._M_dataplus._M_p;
          local_60.piece_._M_len = 0x20;
          local_60.piece_._M_str = "\" stored in google.protobuf.Any.";
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_a0,(lts_20250127 *)&val,(AlphaNum *)local_1e8,&local_60,
                     (AlphaNum *)in_R8._M_p);
          message_02._M_str = local_a0._M_dataplus._M_p;
          message_02._M_len = local_a0._M_string_length;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      message_02);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
LAB_00255458:
          bVar5 = false;
        }
        else {
          bVar5 = ConsumeAnyValue(this,pDVar10,&serialized_value);
          if (!bVar5) goto LAB_00255458;
          if ((this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) &&
             (((bVar5 = FieldDescriptor::is_repeated(any_type_url_field), !bVar5 &&
               (bVar5 = Reflection::HasField(local_210,message,any_type_url_field), bVar5)) ||
              ((bVar5 = FieldDescriptor::is_repeated(any_value_field), !bVar5 &&
               (bVar5 = Reflection::HasField(local_210,message,any_value_field), bVar5)))))) {
            message_01._M_str = "Non-repeated Any specified multiple times.";
            message_01._M_len = 0x2a;
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        message_01);
            goto LAB_00255458;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)prefix_and_full_type_name._M_dataplus._M_p == &prefix_and_full_type_name.field_2) {
            local_f8.field_2._8_8_ = prefix_and_full_type_name.field_2._8_8_;
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          }
          else {
            local_f8._M_dataplus._M_p = prefix_and_full_type_name._M_dataplus._M_p;
          }
          local_f8.field_2._M_allocated_capacity._1_7_ =
               prefix_and_full_type_name.field_2._M_allocated_capacity._1_7_;
          local_f8.field_2._M_local_buf[0] = prefix_and_full_type_name.field_2._M_local_buf[0];
          local_f8._M_string_length = prefix_and_full_type_name._M_string_length;
          prefix_and_full_type_name._M_string_length = 0;
          prefix_and_full_type_name.field_2._M_local_buf[0] = '\0';
          prefix_and_full_type_name._M_dataplus._M_p = (pointer)&prefix_and_full_type_name.field_2;
          Reflection::SetString(local_210,message,any_type_url_field,&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)serialized_value._M_dataplus._M_p == paVar1) {
            local_118.field_2._8_8_ = serialized_value.field_2._8_8_;
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          }
          else {
            local_118._M_dataplus._M_p = serialized_value._M_dataplus._M_p;
          }
          local_118.field_2._M_allocated_capacity._1_7_ =
               serialized_value.field_2._M_allocated_capacity._1_7_;
          local_118.field_2._M_local_buf[0] = serialized_value.field_2._M_local_buf[0];
          local_118._M_string_length = serialized_value._M_string_length;
          serialized_value._M_string_length = 0;
          serialized_value.field_2._M_local_buf[0] = '\0';
          serialized_value._M_dataplus._M_p = (pointer)paVar1;
          Reflection::SetString(local_210,message,any_value_field,&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          bVar5 = ConsumeField::anon_class_32_4_2c58ab61::operator()(&skip_parsing,true);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)serialized_value._M_dataplus._M_p != paVar1) {
          operator_delete(serialized_value._M_dataplus._M_p,
                          CONCAT71(serialized_value.field_2._M_allocated_capacity._1_7_,
                                   serialized_value.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        bVar5 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)prefix_and_full_type_name._M_dataplus._M_p != &prefix_and_full_type_name.field_2) {
        operator_delete(prefix_and_full_type_name._M_dataplus._M_p,
                        CONCAT71(prefix_and_full_type_name.field_2._M_allocated_capacity._1_7_,
                                 prefix_and_full_type_name.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      bVar5 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prefix._M_dataplus._M_p != &prefix.field_2) {
      operator_delete(prefix._M_dataplus._M_p,
                      CONCAT71(prefix.field_2._M_allocated_capacity._1_7_,
                               prefix.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)full_type_name._M_dataplus._M_p == &full_type_name.field_2) goto LAB_00255fac;
    uVar15 = CONCAT71(full_type_name.field_2._M_allocated_capacity._1_7_,
                      full_type_name.field_2._M_local_buf[0]);
    _Var16._M_p = full_type_name._M_dataplus._M_p;
LAB_00255724:
    operator_delete(_Var16._M_p,uVar15 + 1);
    goto LAB_00255fac;
  }
LAB_00254e94:
  _val = (pointer)&local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&val,"[","");
  bVar5 = TryConsume(this,(string *)&val);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_val != &local_250) {
    operator_delete(_val,local_250._M_allocated_capacity + 1);
  }
  if (bVar5) {
    bVar5 = ConsumeFullTypeName(this,&field_name);
    if (bVar5) {
      _val = (pointer)&local_250;
      std::__cxx11::string::_M_construct<char_const*>((string *)&val,"]","");
      bVar5 = ConsumeBeforeWhitespace(this,(string *)&val);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_val != &local_250) {
        operator_delete(_val,local_250._M_allocated_capacity + 1);
      }
      if (bVar5) {
        TryConsumeWhitespace(this);
        pFVar2 = this->finder_;
        if (pFVar2 == (Finder *)0x0) {
          MVar20 = Message::GetMetadata(message);
          printable_name._M_str = field_name._M_dataplus._M_p;
          printable_name._M_len = field_name._M_string_length;
          field = DescriptorPool::FindExtensionByPrintableName
                            ((MVar20.descriptor)->file_->pool_,MVar20.descriptor,printable_name);
        }
        else {
          iVar7 = (*pFVar2->_vptr_Finder[2])(pFVar2,message,&field_name);
          field = (FieldDescriptor *)CONCAT44(extraout_var_00,iVar7);
        }
        if (field != (FieldDescriptor *)0x0) goto LAB_0025580c;
        if ((this->allow_unknown_field_ != false) || (this->allow_unknown_extension_ != false)) {
          local_228 = (pDVar10->all_names_).payload_;
          local_230 = (ulong)*(ushort *)(local_228 + 2);
          _val = (pointer)0x14;
          local_258._M_head_impl = (LogMessageData *)0x385c1a;
          local_250._M_allocated_capacity = field_name._M_string_length;
          local_250._8_8_ = field_name._M_dataplus._M_p;
          local_240 = 0x32;
          local_238 = "\" which is not defined or is not an extension of \"";
          local_228 = local_228 + ~local_230;
          local_220 = 2;
          local_218 = "\".";
          pieces._M_len = field_name._M_string_length;
          pieces._M_array = (iterator)0x5;
          absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
                    ((string *)local_1e8,(strings_internal *)&val,pieces);
          message_00._M_str = (char *)local_1e8._0_8_;
          message_00._M_len = local_1e8._8_8_;
          in_R8._M_p = (pointer)local_1e8._0_8_;
          ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        message_00);
          if ((AlphaNum *)local_1e8._0_8_ != (AlphaNum *)local_1d8) {
            operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
          }
          bVar18 = 0;
          goto LAB_002557ff;
        }
        local_228 = (pDVar10->all_names_).payload_;
        local_230 = (ulong)*(ushort *)(local_228 + 2);
        _val = (pointer)0xb;
        local_258._M_head_impl = (LogMessageData *)0x385be1;
        local_250._M_allocated_capacity = field_name._M_string_length;
        local_250._8_8_ = field_name._M_dataplus._M_p;
        local_240 = 0x2c;
        local_238 = "\" is not defined or is not an extension of \"";
        local_228 = local_228 + ~local_230;
        local_220 = 2;
        local_218 = "\".";
        pieces_00._M_len = field_name._M_string_length;
        pieces_00._M_array = (iterator)0x5;
        absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
                  ((string *)local_1e8,(strings_internal *)&val,pieces_00);
        message_03._M_str = (char *)local_1e8._0_8_;
        message_03._M_len = local_1e8._8_8_;
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    message_03);
LAB_00255f89:
        _Var16._M_p = (pointer)local_1e8._0_8_;
        if ((AlphaNum *)local_1e8._0_8_ != (AlphaNum *)local_1d8) {
LAB_00255fa2:
          operator_delete(_Var16._M_p,local_1d8._0_8_ + 1);
        }
      }
    }
LAB_00255faa:
    bVar5 = false;
  }
  else {
    bVar5 = ConsumeIdentifierBeforeWhitespace(this,&field_name);
    if (!bVar5) goto LAB_00255faa;
    TryConsumeWhitespace(this);
    if ((this->allow_field_number_ == true) &&
       (text._M_str = (char *)&val, text._M_len = (size_t)field_name._M_dataplus._M_p,
       bVar5 = absl::lts_20250127::numbers_internal::safe_strto32_base
                         ((numbers_internal *)field_name._M_string_length,text,
                          (Nonnull<int32_t_*>)0xa,(int)in_R8._M_p), _Var16._M_p = _val, bVar5)) {
      number = val;
      pEVar8 = Descriptor::FindExtensionRangeContainingNumber(pDVar10,val);
      if (pEVar8 == (ExtensionRange *)0x0) {
        pRVar11 = Descriptor::FindReservedRangeContainingNumber(pDVar10,number);
        if (pRVar11 == (ReservedRange *)0x0) {
          field = Descriptor::FindFieldByNumber(pDVar10,number);
          goto LAB_0025557f;
        }
        bVar18 = 1;
      }
      else {
        pFVar2 = this->finder_;
        if (pFVar2 == (Finder *)0x0) {
          field = DescriptorPool::FindExtensionByNumber(pDVar10->file_->pool_,pDVar10,number);
        }
        else {
          iVar7 = (*pFVar2->_vptr_Finder[3])(pFVar2,pDVar10,(ulong)_Var16._M_p & 0xffffffff);
          field = (FieldDescriptor *)CONCAT44(extraout_var_01,iVar7);
        }
LAB_0025557f:
        bVar18 = 0;
      }
      if (field == (FieldDescriptor *)0x0) {
LAB_0025558f:
        if (bVar18 == 0) goto LAB_00255734;
      }
LAB_002557ff:
      if (field != (FieldDescriptor *)0x0) goto LAB_0025580c;
      if (((this->allow_unknown_field_ == false) && ((this->allow_unknown_extension_ & 1U) == 0)) &&
         (bVar18 == 0)) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&val,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
                   ,0x261,"allow_unknown_field_ || allow_unknown_extension_ || reserved_field");
        goto LAB_00256122;
      }
      _val = (pointer)&local_250;
      std::__cxx11::string::_M_construct<char_const*>((string *)&val,":","");
      bVar5 = TryConsumeBeforeWhitespace(this,(string *)&val);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_val != &local_250) {
        operator_delete(_val,local_250._M_allocated_capacity + 1);
      }
      if (bVar5) {
        TryConsumeWhitespace(this);
        _val = (pointer)&local_250;
        std::__cxx11::string::_M_construct<char_const*>((string *)&val,"{","");
        _Var16._M_p = _val;
        __n._M_head_impl = (LogMessageData *)(this->tokenizer_).current_.text._M_string_length;
        if ((__n._M_head_impl == local_258._M_head_impl) &&
           ((__n._M_head_impl == (LogMessageData *)0x0 ||
            (iVar7 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,_val,
                          (size_t)__n._M_head_impl), iVar7 == 0)))) {
          bVar5 = false;
        }
        else {
          local_1e8._0_8_ = (AlphaNum *)local_1d8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"<","");
          uVar15 = local_1e8._0_8_;
          __n_00 = (pointer)(this->tokenizer_).current_.text._M_string_length;
          if (__n_00 == (pointer)local_1e8._8_8_) {
            if (__n_00 == (pointer)0x0) {
              bVar5 = false;
            }
            else {
              iVar7 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,(void *)local_1e8._0_8_
                           ,(size_t)__n_00);
              bVar5 = iVar7 != 0;
            }
          }
          else {
            bVar5 = true;
          }
          _Var16._M_p = _val;
          if ((AlphaNum *)uVar15 != (AlphaNum *)local_1d8) {
            operator_delete((void *)uVar15,local_1d8._0_8_ + 1);
            _Var16._M_p = _val;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var16._M_p != &local_250) {
          operator_delete(_Var16._M_p,local_250._M_allocated_capacity + 1);
        }
        if (!bVar5) goto LAB_0025607f;
        bVar5 = SkipFieldValue(this);
      }
      else {
LAB_0025607f:
        bVar5 = SkipFieldMessage(this);
      }
    }
    else {
      name._M_str = field_name._M_dataplus._M_p;
      name._M_len = field_name._M_string_length;
      field = Descriptor::FindFieldByName(pDVar10,name);
      if (field != (FieldDescriptor *)0x0) goto LAB_0025580c;
      _val = (pointer)&local_250;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&val,field_name._M_dataplus._M_p,
                 field_name._M_dataplus._M_p + field_name._M_string_length);
      absl::lts_20250127::AsciiStrToLower((Nonnull<std::string_*>)&val);
      name_00._M_str = _val;
      name_00._M_len = (size_t)local_258._M_head_impl;
      field = Descriptor::FindFieldByName(pDVar10,name_00);
      if (field != (FieldDescriptor *)0x0) {
        bVar5 = internal::cpp::IsGroupLike(field);
        if (bVar5) {
          if (field != (FieldDescriptor *)0x0) {
            pDVar9 = FieldDescriptor::message_type(field);
            puVar4 = (ushort *)(pDVar9->all_names_).payload_;
            uVar14 = (ulong)*puVar4;
            if ((field_name._M_string_length != uVar14) ||
               ((uVar14 != 0 &&
                (iVar7 = bcmp((void *)((long)puVar4 + ~uVar14),field_name._M_dataplus._M_p,uVar14),
                iVar7 != 0)))) goto LAB_00255086;
          }
        }
        else {
LAB_00255086:
          field = (FieldDescriptor *)0x0;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_val != &local_250) {
        operator_delete(_val,local_250._M_allocated_capacity + 1);
      }
      if (field == (FieldDescriptor *)0x0) {
        if (this->allow_case_insensitive_field_ == true) {
          _val = (pointer)&local_250;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&val,field_name._M_dataplus._M_p,
                     field_name._M_dataplus._M_p + field_name._M_string_length);
          absl::lts_20250127::AsciiStrToLower((Nonnull<std::string_*>)&val);
          lowercase_name._M_str = _val;
          lowercase_name._M_len = (size_t)local_258._M_head_impl;
          field = Descriptor::FindFieldByLowercaseName(pDVar10,lowercase_name);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_val != &local_250) {
            operator_delete(_val,local_250._M_allocated_capacity + 1);
          }
          if (field != (FieldDescriptor *)0x0) goto LAB_0025580c;
        }
        __n_01 = field_name._M_string_length;
        _Var16._M_p = field_name._M_dataplus._M_p;
        uVar14 = (ulong)pDVar10->reserved_name_count_;
        if (0 < (long)uVar14) {
          in_R8._M_p = (pointer)pDVar10->reserved_names_;
          uVar19 = CONCAT71(MVar20.descriptor._1_7_,1);
          uVar17 = 1;
          local_210 = this_01;
          do {
            if ((*(undefined8 **)(((AlphaNum *)in_R8._M_p)->digits_ + uVar17 * 8 + -0x18))[1] ==
                __n_01) {
              if (__n_01 == 0) break;
              local_14c = (uint)uVar19;
              iVar7 = bcmp(_Var16._M_p,
                           (void *)**(undefined8 **)
                                     (((AlphaNum *)in_R8._M_p)->digits_ + uVar17 * 8 + -0x18),__n_01
                          );
              uVar19 = (ulong)local_14c;
              if (iVar7 == 0) break;
            }
            uVar19 = CONCAT71((int7)(uVar19 >> 8),uVar17 < uVar14);
            bVar5 = uVar17 != uVar14;
            uVar17 = uVar17 + 1;
          } while (bVar5);
          bVar18 = (byte)uVar19 & 1;
          this_01 = local_210;
          goto LAB_0025558f;
        }
        bVar18 = 0;
LAB_00255734:
        if (this->allow_unknown_field_ == false) {
          pcVar3 = (pDVar10->all_names_).payload_;
          local_250._M_allocated_capacity = (size_type)*(ushort *)(pcVar3 + 2);
          _val = (pointer)0xe;
          local_258._M_head_impl = (LogMessageData *)0x385c62;
          local_250._8_8_ = pcVar3 + ~local_250._M_allocated_capacity;
          local_240 = 0x16;
          local_238 = "\" has no field named \"";
          local_230 = field_name._M_string_length;
          local_228 = field_name._M_dataplus._M_p;
          local_220 = 2;
          local_218 = "\".";
          pieces_02._M_len = (size_type)"\" has no field named \"";
          pieces_02._M_array = (iterator)0x5;
          absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
                    ((string *)local_1e8,(strings_internal *)&val,pieces_02);
          message_08._M_str = (char *)local_1e8._0_8_;
          message_08._M_len = local_1e8._8_8_;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      message_08);
          goto LAB_00255f89;
        }
        pcVar3 = (pDVar10->all_names_).payload_;
        local_250._M_allocated_capacity = (size_type)*(ushort *)(pcVar3 + 2);
        _val = (pointer)0xe;
        local_258._M_head_impl = (LogMessageData *)0x385c62;
        local_250._8_8_ = pcVar3 + ~local_250._M_allocated_capacity;
        local_240 = 0x16;
        local_238 = "\" has no field named \"";
        local_230 = field_name._M_string_length;
        local_228 = field_name._M_dataplus._M_p;
        local_220 = 2;
        local_218 = "\".";
        pieces_01._M_len = (size_type)"\" has no field named \"";
        pieces_01._M_array = (iterator)0x5;
        absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
                  ((string *)local_1e8,(strings_internal *)&val,pieces_01);
        message_04._M_str = (char *)local_1e8._0_8_;
        message_04._M_len = local_1e8._8_8_;
        in_R8._M_p = (pointer)local_1e8._0_8_;
        ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      message_04);
        if ((AlphaNum *)local_1e8._0_8_ != (AlphaNum *)local_1d8) {
          operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
        }
        goto LAB_002557ff;
      }
LAB_0025580c:
      if ((field->options_->field_0)._impl_.deprecated_ == true) {
        _val = (pointer)0x27;
        local_258._M_head_impl = (LogMessageData *)0x385ccb;
        local_1e8._0_8_ = field_name._M_string_length;
        local_1e8._8_8_ = field_name._M_dataplus._M_p;
        local_60.piece_._M_len = 1;
        local_60.piece_._M_str = "\"";
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&full_type_name,(lts_20250127 *)&val,(AlphaNum *)local_1e8,&local_60,
                   (AlphaNum *)in_R8._M_p);
        message_05._M_str = full_type_name._M_dataplus._M_p;
        message_05._M_len = full_type_name._M_string_length;
        in_R8 = full_type_name._M_dataplus;
        ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      message_05);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)full_type_name._M_dataplus._M_p != &full_type_name.field_2) {
          operator_delete(full_type_name._M_dataplus._M_p,
                          CONCAT71(full_type_name.field_2._M_allocated_capacity._1_7_,
                                   full_type_name.field_2._M_local_buf[0]) + 1);
        }
      }
      if (this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
        bVar18 = field->field_0x1;
        bVar5 = (bool)((bVar18 & 0x20) >> 5);
        if (0xbf < bVar18 != bVar5) {
          pcVar13 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar5,0xbf < bVar18,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&val,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar13);
          goto LAB_00256122;
        }
        if ((bVar18 & 0x20) == 0) {
          bVar5 = Reflection::HasField(this_01,message,field);
          if (bVar5) {
            _val = (pointer)0x14;
            local_258._M_head_impl = (LogMessageData *)0x385cf3;
            local_1e8._0_8_ = field_name._M_string_length;
            local_1e8._8_8_ = field_name._M_dataplus._M_p;
            local_60.piece_._M_len = 0x1e;
            local_60.piece_._M_str = "\" is specified multiple times.";
            absl::lts_20250127::StrCat_abi_cxx11_
                      (&full_type_name,(lts_20250127 *)&val,(AlphaNum *)local_1e8,&local_60,
                       (AlphaNum *)in_R8._M_p);
            message_06._M_str = full_type_name._M_dataplus._M_p;
            message_06._M_len = full_type_name._M_string_length;
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        message_06);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)full_type_name._M_dataplus._M_p != &full_type_name.field_2) {
              local_1d8._0_8_ =
                   CONCAT71(full_type_name.field_2._M_allocated_capacity._1_7_,
                            full_type_name.field_2._M_local_buf[0]);
              _Var16 = full_type_name._M_dataplus;
              goto LAB_00255fa2;
            }
            goto LAB_00255faa;
          }
          bVar18 = field->field_0x1;
        }
        if ((bVar18 & 0x10) != 0) {
          oneof_descriptor = (field->scope_).containing_oneof;
          if (oneof_descriptor == (OneofDescriptor *)0x0) {
            internal::protobuf_assumption_failed
                      ("res != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb31);
          }
          bVar5 = Reflection::HasOneof(this_01,message,oneof_descriptor);
          if (bVar5) {
            pFVar12 = Reflection::GetOneofFieldDescriptor(this_01,message,oneof_descriptor);
            _val = (pointer)0x7;
            local_258._M_head_impl = (LogMessageData *)0x385d27;
            local_1e8._0_8_ = field_name._M_string_length;
            local_1e8._8_8_ = field_name._M_dataplus._M_p;
            local_60.piece_._M_len = 0x21;
            local_60.piece_._M_str = "\" is specified along with field \"";
            puVar4 = (ushort *)(pFVar12->all_names_).payload_;
            full_type_name._M_dataplus._M_p = (pointer)(ulong)*puVar4;
            full_type_name._M_string_length = (long)puVar4 + ~(ulong)full_type_name._M_dataplus._M_p
            ;
            prefix._M_dataplus._M_p = (pointer)0x1c;
            prefix._M_string_length = (size_type)anon_var_dwarf_804286;
            puVar4 = (ushort *)(oneof_descriptor->all_names_).payload_;
            serialized_value._M_dataplus._M_p = (pointer)(ulong)*puVar4;
            serialized_value._M_string_length =
                 (long)puVar4 + ~(ulong)serialized_value._M_dataplus._M_p;
            absl::lts_20250127::StrCat<std::basic_string_view<char,std::char_traits<char>>,char[3]>
                      (&prefix_and_full_type_name,(lts_20250127 *)&val,(AlphaNum *)local_1e8,
                       &local_60,(AlphaNum *)&full_type_name,(AlphaNum *)&prefix,
                       (AlphaNum *)&serialized_value,
                       (basic_string_view<char,_std::char_traits<char>_> *)0x3143eb,
                       (char (*) [3])field);
            message_07._M_str = prefix_and_full_type_name._M_dataplus._M_p;
            message_07._M_len = prefix_and_full_type_name._M_string_length;
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        message_07);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)prefix_and_full_type_name._M_dataplus._M_p != &prefix_and_full_type_name.field_2)
            {
              local_1d8._0_8_ =
                   CONCAT71(prefix_and_full_type_name.field_2._M_allocated_capacity._1_7_,
                            prefix_and_full_type_name.field_2._M_local_buf[0]);
              _Var16 = prefix_and_full_type_name._M_dataplus;
              goto LAB_00255fa2;
            }
            goto LAB_00255faa;
          }
        }
      }
      _val = (pointer)&local_250;
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&val,":","");
        bVar5 = TryConsumeBeforeWhitespace(this,(string *)&val);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_val != &local_250) {
          operator_delete(_val,local_250._M_allocated_capacity + 1);
        }
        if (((bVar5) &&
            (TryConsumeWhitespace(this), (field->options_->field_0)._impl_.weak_ == true)) &&
           ((this->tokenizer_).current_.type == TYPE_STRING)) {
          local_258._M_head_impl = (LogMessageData *)0x0;
          local_250._M_allocated_capacity = local_250._M_allocated_capacity & 0xffffffffffffff00;
          _val = (pointer)&local_250;
          bVar5 = ConsumeString(this,(string *)&val);
          if (bVar5) {
            pFVar2 = this->finder_;
            if (pFVar2 == (Finder *)0x0) {
              factory = (MessageFactory *)0x0;
            }
            else {
              iVar7 = (*pFVar2->_vptr_Finder[5])(pFVar2,field);
              factory = (MessageFactory *)CONCAT44(extraout_var_02,iVar7);
            }
            this_00 = &Reflection::MutableMessage(this_01,message,field,factory)->super_MessageLite;
            data._M_str = _val;
            data._M_len = (size_t)local_258._M_head_impl;
            MessageLite::ParseFromString(this_00,data);
            bVar5 = ConsumeField::anon_class_32_4_2c58ab61::operator()(&skip_parsing,true);
          }
          else {
            bVar5 = false;
          }
          uVar15 = local_250._M_allocated_capacity;
          _Var16._M_p = _val;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_val == &local_250) goto LAB_00255fac;
          goto LAB_00255724;
        }
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)&val,":","");
        bVar5 = ConsumeBeforeWhitespace(this,(string *)&val);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_val != &local_250) {
          operator_delete(_val,local_250._M_allocated_capacity + 1);
        }
        if (!bVar5) goto LAB_00255faa;
        TryConsumeWhitespace(this);
      }
      bVar18 = field->field_0x1;
      bVar5 = (bool)((bVar18 & 0x20) >> 5);
      if (0xbf < bVar18 != bVar5) {
        pcVar13 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar5,0xbf < bVar18,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&val,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,pcVar13);
LAB_00256122:
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&val)
        ;
      }
      if ((bVar18 & 0x20) != 0) {
        _val = (pointer)&local_250;
        std::__cxx11::string::_M_construct<char_const*>((string *)&val,"[","");
        bVar5 = TryConsume(this,(string *)&val);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_val != &local_250) {
          operator_delete(_val,local_250._M_allocated_capacity + 1);
        }
        if (bVar5) {
          _val = (pointer)&local_250;
          std::__cxx11::string::_M_construct<char_const*>((string *)&val,"]","");
          bVar5 = TryConsume(this,(string *)&val);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_val != &local_250) {
            operator_delete(_val,local_250._M_allocated_capacity + 1);
          }
          if (!bVar5) {
            local_210 = this_01;
            do {
              if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10) {
                bVar5 = ConsumeFieldMessage(this,message,local_210,field);
              }
              else {
                bVar5 = ConsumeFieldValue(this,message,local_210,field);
              }
              if (bVar5 == false) goto LAB_00255faa;
              _val = (pointer)&local_250;
              std::__cxx11::string::_M_construct<char_const*>((string *)&val,"]","");
              bVar5 = TryConsume(this,(string *)&val);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_val != &local_250) {
                operator_delete(_val,local_250._M_allocated_capacity + 1);
              }
              if (bVar5) goto LAB_00255dbb;
              _val = (pointer)&local_250;
              std::__cxx11::string::_M_construct<char_const*>((string *)&val,",","");
              bVar6 = Consume(this,(string *)&val);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_val != &local_250) {
                operator_delete(_val,local_250._M_allocated_capacity + 1);
              }
              bVar5 = false;
            } while (bVar6);
            goto LAB_00255fac;
          }
LAB_00255dbb:
          bVar5 = true;
          goto LAB_00256089;
        }
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10) {
        bVar6 = ConsumeFieldMessage(this,message,this_01,field);
      }
      else {
        bVar6 = ConsumeFieldValue(this,message,this_01,field);
      }
      bVar5 = true;
      if (bVar6 == false) goto LAB_00255faa;
    }
LAB_00256089:
    bVar5 = ConsumeField::anon_class_32_4_2c58ab61::operator()(&skip_parsing,bVar5);
  }
LAB_00255fac:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_name._M_dataplus._M_p != &field_name.field_2) {
    operator_delete(field_name._M_dataplus._M_p,
                    CONCAT71(field_name.field_2._M_allocated_capacity._1_7_,
                             field_name.field_2._M_local_buf[0]) + 1);
  }
  return bVar5;
}

Assistant:

bool ConsumeField(Message* message) {
    const Reflection* reflection = message->GetReflection();
    const Descriptor* descriptor = message->GetDescriptor();

    std::string field_name;
    bool reserved_field = false;
    const FieldDescriptor* field = nullptr;
    int start_line = tokenizer_.current().line;
    int start_column = tokenizer_.current().column;

    auto skip_parsing = [&](bool result) {
      // For historical reasons, fields may optionally be separated by commas or
      // semicolons.
      TryConsume(";") || TryConsume(",");

      // If a parse info tree exists, add the location for the parsed
      // field.
      if (parse_info_tree_ != nullptr) {
        int end_line = tokenizer_.previous().line;
        int end_column = tokenizer_.previous().end_column;

        RecordLocation(
            parse_info_tree_, field,
            ParseLocationRange(ParseLocation(start_line, start_column),
                               ParseLocation(end_line, end_column)));
      }

      return result;
    };

    const FieldDescriptor* any_type_url_field;
    const FieldDescriptor* any_value_field;
    if (internal::GetAnyFieldDescriptors(*message, &any_type_url_field,
                                         &any_value_field) &&
        TryConsume("[")) {
      std::string full_type_name, prefix;
      DO(ConsumeAnyTypeUrl(&full_type_name, &prefix));
      std::string prefix_and_full_type_name =
          absl::StrCat(prefix, full_type_name);
      DO(ConsumeBeforeWhitespace("]"));
      TryConsumeWhitespace();
      // ':' is optional between message labels and values.
      if (TryConsumeBeforeWhitespace(":")) {
        TryConsumeWhitespace();
      }
      std::string serialized_value;
      const Descriptor* value_descriptor =
          finder_ ? finder_->FindAnyType(*message, prefix, full_type_name)
                  : DefaultFinderFindAnyType(*message, prefix, full_type_name);
      if (value_descriptor == nullptr) {
        ReportError(absl::StrCat("Could not find type \"",
                                 prefix_and_full_type_name,
                                 "\" stored in google.protobuf.Any."));
        return false;
      }
      DO(ConsumeAnyValue(value_descriptor, &serialized_value));
      if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
        // Fail if any_type_url_field has already been specified.
        if ((!any_type_url_field->is_repeated() &&
             reflection->HasField(*message, any_type_url_field)) ||
            (!any_value_field->is_repeated() &&
             reflection->HasField(*message, any_value_field))) {
          ReportError("Non-repeated Any specified multiple times.");
          return false;
        }
      }
      reflection->SetString(message, any_type_url_field,
                            std::move(prefix_and_full_type_name));
      reflection->SetString(message, any_value_field,
                            std::move(serialized_value));
      return skip_parsing(true);
    }
    if (TryConsume("[")) {
      // Extension.
      DO(ConsumeFullTypeName(&field_name));
      DO(ConsumeBeforeWhitespace("]"));
      TryConsumeWhitespace();

      field = finder_ ? finder_->FindExtension(message, field_name)
                      : DefaultFinderFindExtension(message, field_name);

      if (field == nullptr) {
        if (!allow_unknown_field_ && !allow_unknown_extension_) {
          ReportError(absl::StrCat("Extension \"", field_name,
                                   "\" is not defined or "
                                   "is not an extension of \"",
                                   descriptor->full_name(), "\"."));
          return false;
        } else {
          ReportWarning(absl::StrCat(
              "Ignoring extension \"", field_name,
              "\" which is not defined or is not an extension of \"",
              descriptor->full_name(), "\"."));
        }
      }
    } else {
      DO(ConsumeIdentifierBeforeWhitespace(&field_name));
      TryConsumeWhitespace();

      int32_t field_number;
      if (allow_field_number_ && absl::SimpleAtoi(field_name, &field_number)) {
        if (descriptor->IsExtensionNumber(field_number)) {
          field = finder_
                      ? finder_->FindExtensionByNumber(descriptor, field_number)
                      : DefaultFinderFindExtensionByNumber(descriptor,
                                                           field_number);
        } else if (descriptor->IsReservedNumber(field_number)) {
          reserved_field = true;
        } else {
          field = descriptor->FindFieldByNumber(field_number);
        }
      } else {
        field = descriptor->FindFieldByName(field_name);
        // Group-like delimited fields will accept both the capitalized type
        // names as well.
        if (field == nullptr) {
          std::string lower_field_name = field_name;
          absl::AsciiStrToLower(&lower_field_name);
          field = descriptor->FindFieldByName(lower_field_name);
          // If the case-insensitive match worked but the field is NOT a group,
          if (field != nullptr && !internal::cpp::IsGroupLike(*field)) {
            field = nullptr;
          }
          if (field != nullptr && field->message_type()->name() != field_name) {
            field = nullptr;
          }
        }

        if (field == nullptr && allow_case_insensitive_field_) {
          std::string lower_field_name = field_name;
          absl::AsciiStrToLower(&lower_field_name);
          field = descriptor->FindFieldByLowercaseName(lower_field_name);
        }

        if (field == nullptr) {
          reserved_field = descriptor->IsReservedName(field_name);
        }
      }
      if (field == nullptr && !reserved_field) {
        if (!allow_unknown_field_) {
          ReportError(absl::StrCat("Message type \"", descriptor->full_name(),
                                   "\" has no field named \"", field_name,
                                   "\"."));
          return false;
        } else {
          ReportWarning(absl::StrCat("Message type \"", descriptor->full_name(),
                                     "\" has no field named \"", field_name,
                                     "\"."));
        }
      }
    }

    // Skips unknown or reserved fields.
    if (field == nullptr) {
      ABSL_CHECK(allow_unknown_field_ || allow_unknown_extension_ ||
                 reserved_field);

      // Try to guess the type of this field.
      // If this field is not a message, there should be a ":" between the
      // field name and the field value and also the field value should not
      // start with "{" or "<" which indicates the beginning of a message body.
      // If there is no ":" or there is a "{" or "<" after ":", this field has
      // to be a message or the input is ill-formed.
      if (TryConsumeBeforeWhitespace(":")) {
        TryConsumeWhitespace();
        if (!LookingAt("{") && !LookingAt("<")) {
          return skip_parsing(SkipFieldValue());
        }
      }
      return skip_parsing(SkipFieldMessage());
    }

    if (field->options().deprecated()) {
      ReportWarning(absl::StrCat("text format contains deprecated field \"",
                                 field_name, "\""));
    }

    if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      // Fail if the field is not repeated and it has already been specified.
      if (!field->is_repeated() && reflection->HasField(*message, field)) {
        ReportError(absl::StrCat("Non-repeated field \"", field_name,
                                 "\" is specified multiple times."));
        return false;
      }
      // Fail if the field is a member of a oneof and another member has already
      // been specified.
      const OneofDescriptor* oneof = field->containing_oneof();
      if (oneof != nullptr && reflection->HasOneof(*message, oneof)) {
        const FieldDescriptor* other_field =
            reflection->GetOneofFieldDescriptor(*message, oneof);
        ReportError(absl::StrCat("Field \"", field_name,
                                 "\" is specified along with "
                                 "field \"",
                                 other_field->name(),
                                 "\", another member "
                                 "of oneof \"",
                                 oneof->name(), "\"."));
        return false;
      }
    }

    // Perform special handling for embedded message types.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // ':' is optional here.
      bool consumed_semicolon = TryConsumeBeforeWhitespace(":");
      if (consumed_semicolon) {
        TryConsumeWhitespace();
      }
      if (consumed_semicolon && field->options().weak() &&
          LookingAtType(io::Tokenizer::TYPE_STRING)) {
        // we are getting a bytes string for a weak field.
        std::string tmp;
        DO(ConsumeString(&tmp));
        MessageFactory* factory =
            finder_ ? finder_->FindExtensionFactory(field) : nullptr;
        reflection->MutableMessage(message, field, factory)
            ->ParseFromString(tmp);
        return skip_parsing(true);
      }
    } else {
      // ':' is required here.
      DO(ConsumeBeforeWhitespace(":"));
      TryConsumeWhitespace();
    }

    if (field->is_repeated() && TryConsume("[")) {
      // Short repeated format, e.g.  "foo: [1, 2, 3]".
      if (!TryConsume("]")) {
        // "foo: []" is treated as empty.
        while (true) {
          if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            // Perform special handling for embedded message types.
            DO(ConsumeFieldMessage(message, reflection, field));
          } else {
            DO(ConsumeFieldValue(message, reflection, field));
          }
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      DO(ConsumeFieldMessage(message, reflection, field));
    } else {
      DO(ConsumeFieldValue(message, reflection, field));
    }

    return skip_parsing(true);
  }